

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void __thiscall StackSymbol::print(StackSymbol *this)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  int local_18;
  int local_14;
  int i_1;
  int i;
  StackSymbol *this_local;
  
  if (this->type_ == kInt) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Int Value: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->value_).int_value);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->type_ == kIntArray) {
    std::operator<<((ostream *)&std::cout,"Int Array: ");
    for (local_14 = 0;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&(this->value_).int_array),
        local_14 < (int)sVar3; local_14 = local_14 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(this->value_).int_array,(long)local_14);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
      std::operator<<(poVar1," ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else if (this->type_ == kReal) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Real Value: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->value_).real_value);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->type_ == kRealArray) {
    std::operator<<((ostream *)&std::cout,"Real Array: ");
    for (local_18 = 0;
        sVar3 = std::vector<double,_std::allocator<double>_>::size(&(this->value_).real_array),
        local_18 < (int)sVar3; local_18 = local_18 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->value_).real_array,(long)local_18);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar5);
      std::operator<<(poVar1," ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"===================================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void StackSymbol::print() const {
    if (type_ == StackSymbol::Type::kInt) {
        std::cout << "Int Value: " << value_.int_value << std::endl;
    } else if (type_ == StackSymbol::Type::kIntArray) {
        std::cout << "Int Array: ";
        for (int i = 0; i < (int)value_.int_array.size(); i++) {
            std::cout << value_.int_array[i] << " ";
        }
        std::cout << std::endl;
    } else if (type_ == StackSymbol::Type::kReal) {
        std::cout << "Real Value: " << value_.real_value << std::endl;
    } else if (type_ == StackSymbol::Type::kRealArray) {
        std::cout << "Real Array: ";
        for (int i = 0; i < (int)value_.real_array.size(); i++) {
            std::cout << value_.real_array[i] << " ";
        }
        std::cout << std::endl;
    }
    std::cout << "===================================" << std::endl;
}